

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void tricore_tr_translate_insn(DisasContextBase_conflict1 *dcbase,CPUState_conflict *cpu)

{
  int iVar1;
  abi_ptr_conflict addr;
  long lVar2;
  CPUArchState_conflict30 *env;
  TCGContext_conflict9 *pTVar3;
  long lVar4;
  TCGv_ptr pTVar5;
  DisasJumpType DVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uintptr_t o_3;
  undefined1 *puVar10;
  TCGv_i32 pTVar11;
  TCGv_i64 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i32 pTVar14;
  TCGv_i32 pTVar15;
  TCGv_i32 pTVar16;
  ushort uVar17;
  int32_t arg2;
  uintptr_t o_15;
  TCGArg TVar18;
  short sVar19;
  uint uVar20;
  uintptr_t o_14;
  undefined8 *puVar21;
  uintptr_t o_2;
  TCGTemp *pTVar22;
  ulong uVar23;
  uint uVar24;
  DisasJumpType op1;
  TCGCond TVar25;
  TCGOpcode TVar26;
  code *func;
  TCGContext_conflict9 *pTVar27;
  MemOp MVar28;
  byte bVar29;
  uintptr_t o_7;
  DisasJumpType DVar30;
  uintptr_t o;
  TCGTemp *pTVar31;
  uintptr_t o_1;
  TCGTemp *ts;
  TCGContext_conflict9 *tcg_ctx;
  bool bVar32;
  TCGTemp *local_98;
  TCGTemp *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  TCGTemp *local_70;
  undefined8 local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  lVar2 = *(long *)&dcbase[2].pc_first;
  pTVar27 = *(TCGContext_conflict9 **)(lVar2 + 0x2e8);
  env = (CPUArchState_conflict30 *)cpu->env_ptr;
  local_88 = (TCGTemp *)(ulong)dcbase->pc_next;
  if (*(int *)(lVar2 + 0x57c) == 0) {
    bVar32 = *(TCGTemp **)(lVar2 + 0x578 + (long)*(int *)(lVar2 + 0x39e0) * 8) == local_88;
  }
  else {
    puVar10 = (undefined1 *)g_tree_lookup(*(GTree **)(lVar2 + 0x780),&local_88);
    bVar32 = puVar10 == &DAT_00000001;
  }
  if (bVar32) {
    dcbase->is_jmp = DISAS_TARGET_6;
    return;
  }
  DVar6 = cpu_lduw_code_tricore(env,dcbase->pc_next);
  uVar8 = dcbase->pc_next;
  for (puVar21 = *(undefined8 **)(*(long *)&dcbase[2].pc_first + 0x358);
      puVar21 != (undefined8 *)0x0; puVar21 = (undefined8 *)*puVar21) {
    lVar2 = puVar21[1];
    if ((((*(ulong *)(lVar2 + 0x18) <= (ulong)uVar8) && ((ulong)uVar8 <= *(ulong *)(lVar2 + 0x20)))
        || (*(ulong *)(lVar2 + 0x20) < *(ulong *)(lVar2 + 0x18))) &&
       (*(char *)(lVar2 + 0x14) != '\x01')) break;
  }
  if (puVar21 != (undefined8 *)0x0) {
    pTVar3 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
    tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                        (long)(int)uVar8);
    lVar2 = *(long *)&dcbase[2].pc_first;
    uVar8 = dcbase->pc_next;
    pTVar11 = tcg_const_i32_tricore(pTVar27,(DVar6 & DISAS_TOO_MANY) * 2 + 2);
    pTVar12 = tcg_const_i64_tricore(pTVar27,lVar2);
    pTVar13 = tcg_const_i64_tricore(pTVar27,(ulong)uVar8);
    pTVar31 = (TCGTemp *)(pTVar12 + (long)pTVar27);
    ts = (TCGTemp *)(pTVar13 + (long)pTVar27);
    pTVar22 = (TCGTemp *)(pTVar11 + (long)pTVar27);
    local_40 = (TCGTemp *)0x0;
    local_68 = pTVar22;
    local_60 = pTVar31;
    local_58 = pTVar31;
    local_50 = ts;
    local_48 = pTVar22;
    if (*(int *)(lVar2 + 0x4f8) == 1) {
      for (puVar21 = *(undefined8 **)(lVar2 + 0x358); puVar21 != (undefined8 *)0x0;
          puVar21 = (undefined8 *)*puVar21) {
        lVar4 = puVar21[1];
        if (*(char *)(lVar4 + 0x14) == '\0') {
          pTVar12 = tcg_const_i64_tricore(pTVar27,*(int64_t *)(lVar4 + 0x30));
          local_40 = (TCGTemp *)(pTVar12 + (long)pTVar27);
          (**(code **)(lVar2 + 0x178))(lVar2,lVar4,&local_58,4);
          tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar12 + (long)pTVar27));
        }
      }
    }
    else {
      pTVar11 = tcg_const_i32_tricore(pTVar27,2);
      local_88 = pTVar22;
      local_80 = (TCGTemp *)(pTVar11 + (long)pTVar27);
      local_78 = pTVar31;
      local_70 = ts;
      tcg_gen_callN_tricore(pTVar27,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_88);
      tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar11 + (long)pTVar27));
    }
    tcg_temp_free_internal_tricore(pTVar27,ts);
    tcg_temp_free_internal_tricore(pTVar27,local_60);
    tcg_temp_free_internal_tricore(pTVar27,local_68);
    check_exit_request_tricore(pTVar27);
  }
  sVar19 = (short)DVar6;
  bVar29 = (byte)(DVar6 >> 8);
  uVar8 = DVar6 >> 8;
  if ((DVar6 & DISAS_TOO_MANY) == DISAS_NEXT) {
    dcbase[1].is_jmp = DVar6 & 0xffff;
    dcbase[1].pc_next = dcbase->pc_next + 2;
    if ((DVar6 & 0x3e) == 0x10) {
      op1 = 0x10;
    }
    else {
      op1 = DVar6 & 0xfe;
    }
    if (0xfe < op1) goto switchD_00d2849c_caseD_a;
    pTVar27 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
    switch(op1) {
    case DISAS_NEXT:
      decode_sr_system((DisasContext_conflict14 *)dcbase);
      goto LAB_00d2a5c4;
    case DISAS_NORETURN:
    case 0x12:
    case 0x1a:
    case 0x22:
    case 0x26:
    case 0x2a:
    case 0x30:
    case 0x3a:
    case 0x40:
    case 0x42:
    case 0x52:
    case 0x5a:
    case 0x60:
    case 0x62:
    case 0x6a:
    case 0x7a:
    case 0x80:
    case 0xa2:
    case 0xa6:
    case 0xc6:
    case 0xe2:
      uVar8 = uVar8 & 0xf;
      uVar7 = DVar6 >> 0xc & 0xf;
      if (0x51 < op1) {
        if (op1 < 0x7a) {
          if (0x5f < op1) {
            if (op1 == 0x60) {
              pTVar14 = pTVar27->cpu_gpr_a[uVar8];
LAB_00d29d54:
              pTVar11 = pTVar27->cpu_gpr_d[uVar7];
              goto LAB_00d29d5c;
            }
            if (op1 == 0x62) {
              pTVar5 = pTVar27->cpu_env;
              pTVar11 = pTVar27->cpu_gpr_d[uVar8];
              pTVar14 = pTVar27->cpu_gpr_d[uVar7];
              func = helper_sub_ssov;
LAB_00d29ce5:
              local_78 = (TCGTemp *)((long)&pTVar27->pool_cur + (long)pTVar14);
              local_88 = (TCGTemp *)(pTVar5 + (long)pTVar27);
              local_80 = (TCGTemp *)((long)&pTVar27->pool_cur + (long)pTVar11);
              tcg_gen_callN_tricore(pTVar27,func,local_80,3,&local_88);
              goto LAB_00d2a5c4;
            }
            if (op1 == 0x6a) {
              pTVar14 = tcg_const_i32_tricore(pTVar27,0);
              pTVar11 = pTVar27->cpu_gpr_d[uVar8];
              pTVar15 = pTVar27->cpu_gpr_d[0xf];
              pTVar16 = pTVar27->cpu_gpr_d[uVar7];
              TVar25 = TCG_COND_EQ;
              goto LAB_00d29dad;
            }
            goto switchD_00d28881_caseD_2;
          }
          if (op1 == 0x52) {
            pTVar14 = pTVar27->cpu_gpr_d[uVar8];
            pTVar11 = pTVar27->cpu_gpr_d[0xf];
          }
          else {
            if (op1 != 0x5a) goto switchD_00d28881_caseD_2;
            pTVar14 = pTVar27->cpu_gpr_d[0xf];
            pTVar11 = pTVar27->cpu_gpr_d[uVar8];
          }
          pTVar15 = pTVar27->cpu_gpr_d[uVar7];
        }
        else {
          if (0xa5 < op1) {
            if (op1 == 0xa6) {
              pTVar11 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_d[uVar8]);
              pTVar14 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_d[uVar7]);
              TVar26 = INDEX_op_or_i32;
            }
            else {
              if (op1 != 0xc6) {
                if (op1 == 0xe2) {
                  gen_mul_i32s((DisasContext_conflict14 *)dcbase,pTVar27->cpu_gpr_d[uVar8],
                               pTVar27->cpu_gpr_d[uVar8],pTVar27->cpu_gpr_d[uVar7]);
                  goto LAB_00d2a5c4;
                }
                goto switchD_00d28881_caseD_2;
              }
              pTVar11 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_d[uVar8]);
              pTVar14 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_d[uVar7]);
              TVar26 = INDEX_op_xor_i32;
            }
LAB_00d29d3b:
            tcg_gen_op3_tricore(pTVar27,TVar26,(TCGArg)pTVar11,(TCGArg)pTVar11,(TCGArg)pTVar14);
            goto LAB_00d2a5c4;
          }
          if (op1 == 0x7a) {
            pTVar11 = pTVar27->cpu_gpr_d[0xf];
            pTVar14 = pTVar27->cpu_gpr_d[uVar8];
            pTVar15 = pTVar27->cpu_gpr_d[uVar7];
            TVar25 = TCG_COND_LT;
LAB_00d29c51:
            tcg_gen_setcond_i32_tricore(pTVar27,TVar25,pTVar11,pTVar14,pTVar15);
            goto LAB_00d2a5c4;
          }
          if (op1 == 0x80) {
            pTVar14 = pTVar27->cpu_gpr_d[uVar8];
LAB_00d29d0d:
            pTVar11 = pTVar27->cpu_gpr_a[uVar7];
            goto LAB_00d29d5c;
          }
          if (op1 != 0xa2) goto switchD_00d28881_caseD_2;
          pTVar11 = pTVar27->cpu_gpr_d[uVar8];
          pTVar15 = pTVar27->cpu_gpr_d[uVar7];
          pTVar14 = pTVar11;
        }
        gen_sub_d((DisasContext_conflict14 *)dcbase,pTVar14,pTVar11,pTVar15);
        goto LAB_00d2a5c4;
      }
      if (op1 < 0x2a) {
        if (op1 < 0x1a) {
          if (op1 == DISAS_NORETURN) {
            pTVar14 = pTVar27->cpu_gpr_d[uVar8];
            goto LAB_00d29d54;
          }
          if (op1 == 0x12) {
            pTVar14 = pTVar27->cpu_gpr_d[uVar8];
            pTVar11 = pTVar27->cpu_gpr_d[0xf];
            goto LAB_00d29bec;
          }
        }
        else {
          if (op1 == 0x1a) {
            pTVar14 = pTVar27->cpu_gpr_d[0xf];
            pTVar11 = pTVar27->cpu_gpr_d[uVar8];
LAB_00d29bec:
            pTVar15 = pTVar27->cpu_gpr_d[uVar7];
            goto LAB_00d29bf9;
          }
          if (op1 == 0x22) {
            pTVar5 = pTVar27->cpu_env;
            pTVar11 = pTVar27->cpu_gpr_d[uVar8];
            pTVar14 = pTVar27->cpu_gpr_d[uVar7];
            func = helper_add_ssov;
            goto LAB_00d29ce5;
          }
          if (op1 == 0x26) {
            pTVar11 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_d[uVar8]);
            pTVar14 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_d[uVar7]);
            TVar26 = INDEX_op_and_i32;
            goto LAB_00d29d3b;
          }
        }
      }
      else {
        if (0x39 < op1) {
          if (op1 == 0x3a) {
            pTVar11 = pTVar27->cpu_gpr_d[0xf];
            pTVar14 = pTVar27->cpu_gpr_d[uVar8];
            pTVar15 = pTVar27->cpu_gpr_d[uVar7];
            TVar25 = TCG_COND_EQ;
            goto LAB_00d29c51;
          }
          if (op1 == 0x40) {
            pTVar14 = pTVar27->cpu_gpr_a[uVar8];
            goto LAB_00d29d0d;
          }
          if (op1 != 0x42) goto switchD_00d28881_caseD_2;
          pTVar11 = pTVar27->cpu_gpr_d[uVar8];
          pTVar15 = pTVar27->cpu_gpr_d[uVar7];
          pTVar14 = pTVar11;
LAB_00d29bf9:
          gen_add_d((DisasContext_conflict14 *)dcbase,pTVar14,pTVar11,pTVar15);
          goto LAB_00d2a5c4;
        }
        if (op1 == 0x2a) {
          pTVar14 = tcg_const_i32_tricore(pTVar27,0);
          pTVar11 = pTVar27->cpu_gpr_d[uVar8];
          pTVar15 = pTVar27->cpu_gpr_d[0xf];
          pTVar16 = pTVar27->cpu_gpr_d[uVar7];
          TVar25 = TCG_COND_NE;
LAB_00d29dad:
          tcg_gen_movcond_i32_tricore(pTVar27,TVar25,pTVar11,pTVar15,pTVar14,pTVar16,pTVar11);
          goto LAB_00d29db5;
        }
        if (op1 == 0x30) {
          pTVar11 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_a[uVar8]);
          pTVar14 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_a[uVar7]);
          TVar26 = INDEX_op_add_i32;
          goto LAB_00d29d3b;
        }
      }
switchD_00d28881_caseD_2:
      pTVar11 = tcg_const_i32_tricore(pTVar27,2);
      pTVar14 = tcg_const_i32_tricore(pTVar27,1);
      pTVar3 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
      tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                          (long)(int)dcbase->pc_next);
      local_88 = (TCGTemp *)(pTVar27->cpu_env + (long)pTVar27);
      pTVar22 = (TCGTemp *)(pTVar14 + (long)pTVar27);
      local_80 = (TCGTemp *)(pTVar11 + (long)pTVar27);
      local_78 = pTVar22;
      tcg_gen_callN_tricore(pTVar27,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
      dcbase->is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar11 + (long)pTVar27));
      goto LAB_00d2a069;
    case DISAS_TARGET_1:
    case 0x14:
    case 0x44:
    case 0x54:
    case 0x84:
    case 0x94:
    case 0xc4:
    case 0xd4:
      uVar7 = (op1 - DISAS_TARGET_1) * 0x10000000 | op1 - DISAS_TARGET_1 >> 4;
      if (0xd < uVar7) goto switchD_00d28881_caseD_2;
      uVar8 = uVar8 & 0xf;
      uVar24 = DVar6 >> 0xc & 0xf;
      switch(uVar7) {
      case 0:
        uVar23 = (ulong)uVar24;
        tcg_gen_qemu_ld_i32_tricore
                  (pTVar27,pTVar27->cpu_gpr_d[uVar8],pTVar27->cpu_gpr_a[uVar23],
                   (long)dcbase[1].num_insns,MO_8);
LAB_00d288a6:
        pTVar11 = pTVar27->cpu_gpr_a[uVar23];
        arg2 = 1;
        break;
      case 1:
        pTVar11 = pTVar27->cpu_gpr_d[uVar8];
        pTVar14 = pTVar27->cpu_gpr_a[uVar24];
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_8;
        goto LAB_00d2a20c;
      default:
        goto switchD_00d28881_caseD_2;
      case 4:
        pTVar11 = pTVar27->cpu_gpr_d[uVar8];
        goto LAB_00d2a1ca;
      case 5:
        pTVar11 = pTVar27->cpu_gpr_d[uVar8];
        goto LAB_00d2a1f5;
      case 8:
        uVar23 = (ulong)uVar24;
        tcg_gen_qemu_ld_i32_tricore
                  (pTVar27,pTVar27->cpu_gpr_d[uVar8],pTVar27->cpu_gpr_a[uVar23],
                   (long)dcbase[1].num_insns,MO_LESW);
LAB_00d2a4ad:
        pTVar11 = pTVar27->cpu_gpr_a[uVar23];
        arg2 = 2;
        break;
      case 9:
        pTVar11 = pTVar27->cpu_gpr_d[uVar8];
        pTVar14 = pTVar27->cpu_gpr_a[uVar24];
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_LESW;
        goto LAB_00d2a20c;
      case 0xc:
        pTVar11 = pTVar27->cpu_gpr_a[uVar8];
LAB_00d2a1ca:
        uVar23 = (ulong)uVar24;
        tcg_gen_qemu_ld_i32_tricore
                  (pTVar27,pTVar11,pTVar27->cpu_gpr_a[uVar23],(long)dcbase[1].num_insns,MO_LESL);
LAB_00d2a447:
        pTVar11 = pTVar27->cpu_gpr_a[uVar23];
        arg2 = 4;
        break;
      case 0xd:
        pTVar11 = pTVar27->cpu_gpr_a[uVar8];
LAB_00d2a1f5:
        pTVar14 = pTVar27->cpu_gpr_a[uVar24];
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_LESL;
LAB_00d2a20c:
        tcg_gen_qemu_ld_i32_tricore(pTVar27,pTVar11,pTVar14,TVar18,MVar28);
        goto LAB_00d2a5c4;
      }
      tcg_gen_addi_i32_tricore(pTVar27,pTVar11,pTVar11,arg2);
      goto LAB_00d2a5c4;
    case DISAS_TARGET_3:
    case 0x82:
    case 0x86:
    case 0x8a:
    case 0x92:
    case 0x9a:
    case 0xa0:
    case 0xaa:
    case 0xb0:
    case 0xba:
    case 0xc2:
    case 0xca:
    case 0xd2:
    case 0xea:
    case 0xfa:
      uVar8 = uVar8 & 0xf;
      uVar24 = (int)sVar19 >> 0xc;
      if (op1 < 0xaa) {
        if (op1 < 0x8a) {
          if (op1 == DISAS_TARGET_3) {
            gen_shi((DisasContext_conflict14 *)dcbase,pTVar27->cpu_gpr_d[uVar8],
                    pTVar27->cpu_gpr_d[uVar8],uVar24);
            goto LAB_00d2a5c4;
          }
          if (op1 == 0x82) {
            TVar18 = (TCGArg)(int)uVar24;
            pTVar11 = pTVar27->cpu_gpr_d[uVar8];
LAB_00d29e35:
            tcg_gen_op2_tricore(pTVar27,INDEX_op_movi_i32,
                                (TCGArg)((long)&pTVar27->pool_cur + (long)pTVar11),TVar18);
            goto LAB_00d2a5c4;
          }
          if (op1 == 0x86) {
            gen_shaci((DisasContext_conflict14 *)dcbase,pTVar27->cpu_gpr_d[uVar8],
                      pTVar27->cpu_gpr_d[uVar8],uVar24);
            goto LAB_00d2a5c4;
          }
        }
        else if (op1 < 0x9a) {
          if (op1 == 0x8a) {
            pTVar11 = pTVar27->cpu_gpr_d[uVar8];
            pTVar15 = pTVar27->cpu_gpr_d[0xf];
            pTVar14 = tcg_const_i32_tricore(pTVar27,uVar24);
            TVar25 = TCG_COND_NE;
            goto LAB_00d29eb4;
          }
          if (op1 == 0x92) {
            pTVar11 = pTVar27->cpu_gpr_d[uVar8];
            pTVar15 = pTVar27->cpu_gpr_d[0xf];
            goto LAB_00d29e01;
          }
        }
        else {
          if (op1 == 0x9a) {
            pTVar11 = pTVar27->cpu_gpr_d[0xf];
            pTVar15 = pTVar27->cpu_gpr_d[uVar8];
LAB_00d29e01:
            pTVar14 = tcg_const_i32_tricore(pTVar27,uVar24);
            gen_add_d((DisasContext_conflict14 *)dcbase,pTVar11,pTVar15,pTVar14);
            goto LAB_00d29ec8;
          }
          if (op1 == 0xa0) {
            TVar18 = (TCGArg)(DVar6 >> 0xc & 0xf);
            pTVar11 = pTVar27->cpu_gpr_a[uVar8];
            goto LAB_00d29e35;
          }
        }
      }
      else if (op1 < 0xca) {
        if (op1 < 0xba) {
          if (op1 == 0xaa) {
            pTVar15 = tcg_const_i32_tricore(pTVar27,0);
            pTVar16 = tcg_const_i32_tricore(pTVar27,uVar24);
            pTVar11 = pTVar27->cpu_gpr_d[uVar8];
            pTVar14 = pTVar27->cpu_gpr_d[0xf];
            TVar25 = TCG_COND_NE;
LAB_00d29f32:
            tcg_gen_movcond_i32_tricore(pTVar27,TVar25,pTVar11,pTVar14,pTVar15,pTVar16,pTVar11);
            tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar15 + (long)pTVar27));
            pTVar22 = (TCGTemp *)(pTVar16 + (long)pTVar27);
            goto LAB_00d2a5ba;
          }
          if (op1 == 0xb0) {
            pTVar11 = pTVar27->cpu_gpr_a[uVar8];
            pTVar14 = pTVar11;
            goto LAB_00d29b7c;
          }
        }
        else {
          if (op1 == 0xba) {
            pTVar11 = pTVar27->cpu_gpr_d[0xf];
            pTVar14 = pTVar27->cpu_gpr_d[uVar8];
            TVar25 = TCG_COND_EQ;
LAB_00d29eea:
            tcg_gen_setcondi_i32_tricore(pTVar27,TVar25,pTVar11,pTVar14,uVar24);
            goto LAB_00d2a5c4;
          }
          if (op1 == 0xc2) {
            pTVar11 = pTVar27->cpu_gpr_d[uVar8];
            pTVar14 = tcg_const_i32_tricore(pTVar27,uVar24);
            gen_add_d((DisasContext_conflict14 *)dcbase,pTVar11,pTVar11,pTVar14);
            pTVar22 = (TCGTemp *)(pTVar14 + (long)pTVar27);
            goto LAB_00d2a5ba;
          }
        }
      }
      else if (op1 < 0xea) {
        if (op1 == 0xca) {
          pTVar11 = pTVar27->cpu_gpr_d[uVar8];
          pTVar15 = pTVar27->cpu_gpr_d[0xf];
          pTVar14 = tcg_const_i32_tricore(pTVar27,uVar24);
          TVar25 = TCG_COND_EQ;
LAB_00d29eb4:
          gen_cond_add((DisasContext_conflict14 *)dcbase,TVar25,pTVar11,pTVar14,pTVar11,pTVar15);
          goto LAB_00d29ec8;
        }
        if ((op1 == 0xd2) && (((ulong)dcbase[2].tb & 4) != 0)) {
          tcg_gen_op2_tricore(pTVar27,INDEX_op_movi_i32,
                              (TCGArg)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_d[uVar8]),
                              (long)(int)uVar24);
          tcg_gen_sari_i32_tricore
                    (pTVar27,pTVar27->cpu_gpr_d[(ulong)uVar8 + 1],pTVar27->cpu_gpr_d[uVar8],0x1f);
          goto LAB_00d2a5c4;
        }
      }
      else {
        if (op1 == 0xea) {
          pTVar15 = tcg_const_i32_tricore(pTVar27,0);
          pTVar16 = tcg_const_i32_tricore(pTVar27,uVar24);
          pTVar11 = pTVar27->cpu_gpr_d[uVar8];
          pTVar14 = pTVar27->cpu_gpr_d[0xf];
          TVar25 = TCG_COND_EQ;
          goto LAB_00d29f32;
        }
        if (op1 == 0xfa) {
          pTVar11 = pTVar27->cpu_gpr_d[0xf];
          pTVar14 = pTVar27->cpu_gpr_d[uVar8];
          TVar25 = TCG_COND_LT;
          goto LAB_00d29eea;
        }
      }
LAB_00d28f72:
      pTVar11 = tcg_const_i32_tricore(pTVar27,2);
      pTVar14 = tcg_const_i32_tricore(pTVar27,1);
      pTVar3 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
      tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                          (long)(int)dcbase->pc_next);
      local_88 = (TCGTemp *)(pTVar27->cpu_env + (long)pTVar27);
      pTVar22 = (TCGTemp *)(pTVar14 + (long)pTVar27);
      local_80 = (TCGTemp *)(pTVar11 + (long)pTVar27);
      local_78 = pTVar22;
      tcg_gen_callN_tricore(pTVar27,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
      dcbase->is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar11 + (long)pTVar27));
      goto LAB_00d2a5ba;
    case DISAS_TARGET_5:
      pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      pTVar14 = pTVar27->cpu_gpr_a[0xf];
      uVar17 = (ushort)(((ulong)DVar6 & 0xffff) >> 0xc);
      MVar28 = MO_8;
      goto LAB_00d2977f;
    default:
      goto switchD_00d2849c_caseD_a;
    case DISAS_TARGET_9:
    case 0x2c:
    case 0x4c:
    case 0x6c:
    case 0x8c:
    case 0xac:
    case 0xcc:
    case 0xec:
      uVar8 = (op1 - DISAS_TARGET_9) * 0x8000000 | op1 - DISAS_TARGET_9 >> 5;
      if (7 < uVar8) goto switchD_00d28881_caseD_2;
      uVar7 = DVar6 >> 0xc & 0xf;
      uVar24 = DVar6 >> 8 & 0xf;
      switch(uVar8) {
      case 0:
        local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[0xf];
        pTVar11 = pTVar27->cpu_gpr_a[uVar7];
        pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
        pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
        tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
        iVar1 = dcbase[1].num_insns;
LAB_00d28c7b:
        TVar18 = (TCGArg)iVar1;
        MVar28 = MO_8;
        break;
      case 1:
        local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[0xf];
        pTVar11 = pTVar27->cpu_gpr_a[uVar7];
        pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
        pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
        tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_8;
        goto LAB_00d2a5af;
      case 2:
        local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[0xf];
        goto LAB_00d2a3b0;
      case 3:
        local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[0xf];
        goto LAB_00d2a25d;
      case 4:
        local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[0xf];
        pTVar11 = pTVar27->cpu_gpr_a[uVar7];
        pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
        pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
        tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
        iVar1 = dcbase[1].num_insns;
LAB_00d2a1aa:
        TVar18 = (TCGArg)iVar1;
        MVar28 = MO_LESW;
        break;
      case 5:
        local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[0xf];
        pTVar11 = pTVar27->cpu_gpr_a[uVar7];
        pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
        pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
        tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24 * 2);
        iVar1 = dcbase[1].num_insns;
LAB_00d2a393:
        TVar18 = (TCGArg)iVar1;
        MVar28 = MO_LESW;
        goto LAB_00d2a5af;
      case 6:
        local_98 = (TCGTemp *)pTVar27->cpu_gpr_a[0xf];
LAB_00d2a3b0:
        pTVar11 = pTVar27->cpu_gpr_a[uVar7];
        pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
        pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
        tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24 << 2);
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_LESL;
        break;
      case 7:
        local_98 = (TCGTemp *)pTVar27->cpu_gpr_a[0xf];
LAB_00d2a25d:
        pTVar11 = pTVar27->cpu_gpr_a[uVar7];
        pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
        pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
        tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24 << 2);
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_LESL;
LAB_00d2a5af:
        tcg_gen_qemu_st_i32_tricore(pTVar27,(TCGv_i32)local_98,pTVar14,TVar18,MVar28);
        goto LAB_00d2a5ba;
      }
LAB_00d2a3ff:
      tcg_gen_qemu_ld_i32_tricore(pTVar27,(TCGv_i32)local_98,pTVar14,TVar18,MVar28);
LAB_00d2a5ba:
      tcg_temp_free_internal_tricore(pTVar27,pTVar22);
      goto LAB_00d2a5c4;
    case DISAS_TARGET_11:
    case 0x3e:
    case 0x4e:
    case 0x76:
    case 0x7c:
    case 0x7e:
    case 0x8e:
    case 0xbc:
    case 0xce:
    case 0xf6:
    case 0xfc:
switchD_00d2849c_caseD_e:
      uVar20 = DVar6 >> 0xc & 0xf;
      uVar8 = uVar8 & 0xf;
      uVar7 = 0;
      uVar24 = 0;
      break;
    case 0x10:
      pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
      tcg_gen_shli_i32_tricore
                (pTVar27,(TCGv_i32)((long)pTVar22 - (long)pTVar27),pTVar27->cpu_gpr_d[0xf],
                 DVar6 >> 6 & 3);
      tcg_gen_op3_tricore(pTVar27,INDEX_op_add_i32,
                          (long)&pTVar27->pool_cur +
                          *(long *)((long)pTVar27->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78)),
                          (long)&pTVar27->pool_cur +
                          *(long *)((long)pTVar27->cpu_gpr_a + (ulong)(DVar6 >> 9 & 0x78)),
                          (TCGArg)pTVar22);
      goto LAB_00d2a069;
    case 0x16:
    case 0x20:
    case 0x58:
    case 0x78:
    case 0x96:
    case 0xd8:
    case 0xda:
    case 0xe0:
    case 0xf8:
      uVar8 = (uint)bVar29;
      if (op1 < 0x96) {
        if (op1 < 0x58) {
          if (op1 == 0x16) {
            tcg_gen_andi_i32_tricore(pTVar27,pTVar27->cpu_gpr_d[0xf],pTVar27->cpu_gpr_d[0xf],uVar8);
            goto LAB_00d2a5c4;
          }
          if (op1 == 0x20) {
            tcg_gen_subi_i32_tricore(pTVar27,pTVar27->cpu_gpr_a[10],pTVar27->cpu_gpr_a[10],uVar8);
            goto LAB_00d2a5c4;
          }
          goto LAB_00d2a073;
        }
        if (op1 == 0x58) {
          pTVar11 = pTVar27->cpu_gpr_a[10];
          pTVar14 = pTVar27->cpu_gpr_d[0xf];
LAB_00d29fa0:
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          tcg_gen_addi_i32_tricore
                    (pTVar27,(TCGv_i32)((long)pTVar22 - (long)pTVar27),pTVar11,uVar8 << 2);
          tcg_gen_qemu_ld_i32_tricore
                    (pTVar27,pTVar14,(TCGv_i32)((long)pTVar22 - (long)pTVar27),
                     (long)dcbase[1].num_insns,MO_LESL);
        }
        else {
          if (op1 != 0x78) goto LAB_00d2a073;
          pTVar11 = pTVar27->cpu_gpr_a[10];
          pTVar14 = pTVar27->cpu_gpr_d[0xf];
LAB_00d28dd1:
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          tcg_gen_addi_i32_tricore
                    (pTVar27,(TCGv_i32)((long)pTVar22 - (long)pTVar27),pTVar11,uVar8 << 2);
          tcg_gen_qemu_st_i32_tricore
                    (pTVar27,pTVar14,(TCGv_i32)((long)pTVar22 - (long)pTVar27),
                     (long)dcbase[1].num_insns,MO_LESL);
        }
      }
      else {
        if (op1 < 0xda) {
          if (op1 == 0x96) {
            tcg_gen_ori_i32_tricore(pTVar27,pTVar27->cpu_gpr_d[0xf],pTVar27->cpu_gpr_d[0xf],uVar8);
            goto LAB_00d2a5c4;
          }
          if (op1 == 0xd8) {
            pTVar11 = pTVar27->cpu_gpr_a[10];
            pTVar14 = pTVar27->cpu_gpr_a[0xf];
            goto LAB_00d29fa0;
          }
        }
        else {
          if (op1 == 0xda) {
            pTVar11 = (TCGv_i32)(ulong)uVar8;
            pTVar14 = pTVar27->cpu_gpr_d[0xf];
            goto LAB_00d29ffb;
          }
          if (op1 == 0xe0) {
            pTVar11 = tcg_const_i32_tricore(pTVar27,uVar8);
            local_88 = (TCGTemp *)(pTVar27->cpu_env + (long)pTVar27);
            pTVar22 = (TCGTemp *)(pTVar11 + (long)pTVar27);
            local_80 = pTVar22;
            tcg_gen_callN_tricore(pTVar27,helper_bisr,(TCGTemp *)0x0,2,&local_88);
            goto LAB_00d2a069;
          }
          if (op1 == 0xf8) {
            pTVar11 = pTVar27->cpu_gpr_a[10];
            pTVar14 = pTVar27->cpu_gpr_a[0xf];
            goto LAB_00d28dd1;
          }
        }
LAB_00d2a073:
        pTVar11 = tcg_const_i32_tricore(pTVar27,2);
        pTVar14 = tcg_const_i32_tricore(pTVar27,1);
        pTVar3 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
        tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                            (long)(int)dcbase->pc_next);
        local_88 = (TCGTemp *)(pTVar27->cpu_env + (long)pTVar27);
        pTVar22 = (TCGTemp *)(pTVar14 + (long)pTVar27);
        local_80 = (TCGTemp *)(pTVar11 + (long)pTVar27);
        local_78 = pTVar22;
        tcg_gen_callN_tricore(pTVar27,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
        dcbase->is_jmp = DISAS_NORETURN;
        tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar11 + (long)pTVar27));
      }
      goto LAB_00d2a5ba;
    case 0x1e:
    case 0x5e:
switchD_00d2849c_caseD_1e:
      uVar8 = uVar8 & 0xf;
      uVar24 = (int)sVar19 >> 0xc;
      uVar20 = 0;
      uVar7 = 0;
      break;
    case 0x24:
    case 0x34:
    case 100:
    case 0x74:
    case 0xa4:
    case 0xb4:
    case 0xe4:
    case 0xf4:
      uVar7 = (op1 - 0x24) * 0x10000000 | op1 - 0x24 >> 4;
      if (0xd < uVar7) goto switchD_00d28881_caseD_2;
      uVar8 = uVar8 & 0xf;
      uVar24 = DVar6 >> 0xc & 0xf;
      switch(uVar7) {
      case 0:
        uVar23 = (ulong)uVar24;
        tcg_gen_qemu_st_i32_tricore
                  (pTVar27,pTVar27->cpu_gpr_d[uVar8],pTVar27->cpu_gpr_a[uVar23],
                   (long)dcbase[1].num_insns,MO_8);
        goto LAB_00d288a6;
      case 1:
        pTVar11 = pTVar27->cpu_gpr_d[uVar8];
        pTVar14 = pTVar27->cpu_gpr_a[uVar24];
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_8;
        break;
      default:
        goto switchD_00d28881_caseD_2;
      case 4:
        pTVar11 = pTVar27->cpu_gpr_d[uVar8];
        goto LAB_00d2a42b;
      case 5:
        pTVar11 = pTVar27->cpu_gpr_d[uVar8];
        goto LAB_00d2a466;
      case 8:
        uVar23 = (ulong)uVar24;
        tcg_gen_qemu_st_i32_tricore
                  (pTVar27,pTVar27->cpu_gpr_d[uVar8],pTVar27->cpu_gpr_a[uVar23],
                   (long)dcbase[1].num_insns,MO_16);
        goto LAB_00d2a4ad;
      case 9:
        pTVar11 = pTVar27->cpu_gpr_d[uVar8];
        pTVar14 = pTVar27->cpu_gpr_a[uVar24];
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_16;
        break;
      case 0xc:
        pTVar11 = pTVar27->cpu_gpr_a[uVar8];
LAB_00d2a42b:
        uVar23 = (ulong)uVar24;
        tcg_gen_qemu_st_i32_tricore
                  (pTVar27,pTVar11,pTVar27->cpu_gpr_a[uVar23],(long)dcbase[1].num_insns,MO_32);
        goto LAB_00d2a447;
      case 0xd:
        pTVar11 = pTVar27->cpu_gpr_a[uVar8];
LAB_00d2a466:
        pTVar14 = pTVar27->cpu_gpr_a[uVar24];
        TVar18 = (TCGArg)dcbase[1].num_insns;
        MVar28 = MO_32;
      }
      tcg_gen_qemu_st_i32_tricore(pTVar27,pTVar11,pTVar14,TVar18,MVar28);
      goto LAB_00d2a5c4;
    case 0x28:
      pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      pTVar14 = pTVar27->cpu_gpr_a[0xf];
      uVar17 = (ushort)((DVar6 & 0xffff) >> 0xc);
      MVar28 = MO_8;
      goto LAB_00d29881;
    case 0x2e:
    case 0xae:
      uVar8 = uVar8 & 0xf;
      uVar24 = DVar6 >> 0xc & 0xf;
      uVar20 = 0;
      uVar7 = 0;
      break;
    case 0x32:
      decode_sr_accu((DisasContext_conflict14 *)dcbase);
      goto LAB_00d2a5c4;
    case 0x3c:
    case 0x5c:
    case 0x6e:
    case 0xee:
      uVar8 = (uint)(char)bVar29;
LAB_00d28a99:
      uVar20 = 0;
      uVar7 = 0;
      uVar24 = 0;
      break;
    case 0x46:
      pTVar11 = (TCGv_i32)
                ((long)&pTVar27->pool_cur +
                *(long *)((long)pTVar27->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78)));
      TVar26 = INDEX_op_not_i32;
      pTVar14 = pTVar11;
      goto LAB_00d2a006;
    case 0x48:
      pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      goto LAB_00d2973b;
    case 0x68:
      pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      goto LAB_00d29840;
    case 0x88:
      pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      pTVar14 = pTVar27->cpu_gpr_a[0xf];
      uVar17 = (ushort)(DVar6 >> 0xb) & 0x1e;
      MVar28 = MO_LESW;
      goto LAB_00d2977f;
    case 0x9e:
    case 0xde:
      if (((ulong)dcbase[2].tb & 4) != 0) goto switchD_00d2849c_caseD_1e;
      goto switchD_00d2849c_caseD_a;
    case 0xa8:
      pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
      pTVar14 = pTVar27->cpu_gpr_a[0xf];
      uVar17 = (ushort)(DVar6 >> 0xb) & 0x1e;
      MVar28 = MO_LESW;
      goto LAB_00d29881;
    case 0xbe:
    case 0xfe:
      if (((ulong)dcbase[2].tb & 4) != 0) goto switchD_00d2849c_caseD_e;
switchD_00d2849c_caseD_a:
      generate_trap((DisasContext_conflict14 *)dcbase,2,1);
      goto LAB_00d2a5c4;
    case 200:
      pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78));
LAB_00d2973b:
      pTVar14 = pTVar27->cpu_gpr_a[0xf];
      uVar17 = (ushort)(DVar6 >> 10) & 0x3c;
      MVar28 = MO_LESL;
LAB_00d2977f:
      gen_offset_ld((DisasContext_conflict14 *)dcbase,pTVar11,pTVar14,uVar17,MVar28);
      goto LAB_00d2a5c4;
    case 0xdc:
      uVar20 = DVar6 >> 8 & 0xf;
      op1 = 0xdc;
      uVar7 = 0;
      uVar24 = 0;
      uVar8 = 0;
      break;
    case 0xe8:
      pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78));
LAB_00d29840:
      pTVar14 = pTVar27->cpu_gpr_a[0xf];
      uVar17 = (ushort)(DVar6 >> 10) & 0x3c;
      MVar28 = MO_LESL;
LAB_00d29881:
      gen_offset_st((DisasContext_conflict14 *)dcbase,pTVar11,pTVar14,uVar17,MVar28);
      goto LAB_00d2a5c4;
    }
LAB_00d28ec2:
    gen_compute_branch((DisasContext_conflict14 *)dcbase,op1,uVar20,uVar7,uVar24,uVar8);
    goto LAB_00d2a5c4;
  }
  uVar9 = cpu_lduw_code_tricore(env,dcbase->pc_next + 2);
  DVar30 = uVar9 << 0x10;
  dcbase[1].is_jmp = DVar6 & 0xffff | DVar30;
  dcbase[1].pc_next = dcbase->pc_next + 4;
  if ((DVar6 & 0x7f) == 0x6f) {
    op1 = 0x6f;
  }
  else {
    op1 = DVar6 & 0xff;
  }
  uVar7 = op1 - DISAS_TOO_MANY >> 1 | (uint)((op1 - DISAS_TOO_MANY & 1) != 0) << 0x1f;
  if (0x7f < uVar7) goto switchD_00d2849c_caseD_a;
  pTVar27 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
  switch(uVar7) {
  case 0:
    decode_rr_address((DisasContext_conflict14 *)dcbase);
    break;
  case 1:
    decode_rrr2_madd((DisasContext_conflict14 *)dcbase);
    break;
  case 2:
    decode_abs_ldb((DisasContext_conflict14 *)dcbase);
    break;
  case 3:
    decode_bit_logical_t2((DisasContext_conflict14 *)dcbase);
    break;
  case 4:
    decode_bo_addrmode_ld_post_pre_base((DisasContext_conflict14 *)dcbase);
    break;
  case 5:
    decode_rr_accumulator((DisasContext_conflict14 *)dcbase);
    break;
  case 6:
    decode_sys_interrupts((DisasContext_conflict14 *)dcbase);
    break;
  case 7:
    decode_rr_logical_shift((DisasContext_conflict14 *)dcbase);
    break;
  case 8:
  case 0xd:
  case 0x1d:
  case 0x26:
  case 0x3d:
  case 0x48:
  case 0x4d:
  case 0x5d:
  case 0x66:
  case 0x7d:
    decode_rlc_opc((DisasContext_conflict14 *)dcbase,op1);
    break;
  case 9:
    decode_rcr_madd((DisasContext_conflict14 *)dcbase);
    break;
  case 10:
    decode_abs_ldst_context((DisasContext_conflict14 *)dcbase);
    break;
  case 0xb:
    decode_rrrr_extract_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0xc:
  case 0x1c:
  case 0x2c:
  case 0x3c:
  case 0x4c:
  case 0x5a:
  case 0x5c:
  case 100:
  case 0x6c:
  case 0x74:
  case 0x7c:
    uVar8 = uVar8 & 0xf;
    uVar7 = DVar6 >> 0xc & 0xf;
    uVar24 = (int)(uVar9 << 0x14) >> 0x10 & 0xfffffc00U | DVar30 >> 0x16 & 0xffffffc0 | uVar9 & 0x3f
    ;
    if (op1 < 0xb5) {
      if (op1 < 0x59) {
        if (op1 == 0x19) {
          local_98 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)local_98 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar27->cpu_gpr_a[uVar7],uVar24);
          pTVar11 = pTVar27->cpu_gpr_d[uVar8];
LAB_00d29906:
          tcg_gen_qemu_ld_i32_tricore(pTVar27,pTVar11,pTVar14,(long)dcbase[1].num_insns,MO_32);
          pTVar22 = local_98;
          goto LAB_00d2a5ba;
        }
        if (op1 != 0x39) goto LAB_00d28f72;
        if (((ulong)dcbase[2].tb & 4) != 0) {
          local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[uVar8];
          pTVar11 = pTVar27->cpu_gpr_a[uVar7];
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
          iVar1 = dcbase[1].num_insns;
          goto LAB_00d28c7b;
        }
      }
      else {
        if (op1 == 0x59) {
          local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[uVar8];
          pTVar11 = pTVar27->cpu_gpr_a[uVar7];
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
          iVar1 = dcbase[1].num_insns;
LAB_00d2a59e:
          TVar18 = (TCGArg)iVar1;
          MVar28 = MO_32;
          goto LAB_00d2a5af;
        }
        if (op1 != 0x79) {
          if (op1 != 0x99) goto LAB_00d28f72;
          local_98 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)local_98 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar27->cpu_gpr_a[uVar7],uVar24);
          pTVar11 = pTVar27->cpu_gpr_a[uVar8];
          goto LAB_00d29906;
        }
        if (((ulong)dcbase[2].tb & 4) != 0) {
          local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[uVar8];
          pTVar11 = pTVar27->cpu_gpr_a[uVar7];
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
          TVar18 = (TCGArg)dcbase[1].num_insns;
          MVar28 = MO_ASHIFT;
          goto LAB_00d2a3ff;
        }
      }
    }
    else if (op1 < 0xd9) {
      if (op1 == 0xb5) {
        if (((ulong)dcbase[2].tb & 4) != 0) {
          local_98 = (TCGTemp *)pTVar27->cpu_gpr_a[uVar8];
          pTVar11 = pTVar27->cpu_gpr_a[uVar7];
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
          iVar1 = dcbase[1].num_insns;
          goto LAB_00d2a59e;
        }
      }
      else if (op1 == 0xb9) {
        if (((ulong)dcbase[2].tb & 4) != 0) {
          local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[uVar8];
          pTVar11 = pTVar27->cpu_gpr_a[uVar7];
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
          TVar18 = (TCGArg)dcbase[1].num_insns;
          MVar28 = MO_16;
          goto LAB_00d2a3ff;
        }
      }
      else {
        if (op1 != 0xc9) goto LAB_00d28f72;
        if (((ulong)dcbase[2].tb & 4) != 0) {
          local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[uVar8];
          pTVar11 = pTVar27->cpu_gpr_a[uVar7];
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
          iVar1 = dcbase[1].num_insns;
          goto LAB_00d2a1aa;
        }
      }
    }
    else {
      if (op1 == 0xd9) {
        pTVar14 = pTVar27->cpu_gpr_a[uVar8];
        pTVar11 = pTVar27->cpu_gpr_a[uVar7];
LAB_00d29b7c:
        tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
        break;
      }
      if (op1 == 0xe9) {
        if (((ulong)dcbase[2].tb & 4) != 0) {
          local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[uVar8];
          pTVar11 = pTVar27->cpu_gpr_a[uVar7];
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
          TVar18 = (TCGArg)dcbase[1].num_insns;
          MVar28 = MO_ASHIFT;
          goto LAB_00d2a5af;
        }
      }
      else {
        if (op1 != 0xf9) goto LAB_00d28f72;
        if (((ulong)dcbase[2].tb & 4) != 0) {
          local_98 = (TCGTemp *)pTVar27->cpu_gpr_d[uVar8];
          pTVar11 = pTVar27->cpu_gpr_a[uVar7];
          pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
          pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
          tcg_gen_addi_i32_tricore(pTVar27,pTVar14,pTVar11,uVar24);
          iVar1 = dcbase[1].num_insns;
          goto LAB_00d2a393;
        }
      }
    }
    pTVar11 = tcg_const_i32_tricore(pTVar27,2);
    pTVar14 = tcg_const_i32_tricore(pTVar27,1);
    pTVar3 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
    tcg_gen_op2_tricore(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_PC + (long)pTVar3),
                        (long)(int)dcbase->pc_next);
    local_88 = (TCGTemp *)(pTVar27->cpu_env + (long)pTVar27);
    local_80 = (TCGTemp *)(pTVar11 + (long)pTVar27);
    local_78 = (TCGTemp *)(pTVar14 + (long)pTVar27);
    tcg_gen_callN_tricore(pTVar27,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_88);
    dcbase->is_jmp = DISAS_NORETURN;
    tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar11 + (long)pTVar27));
    tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar14 + (long)pTVar27));
    break;
  case 0xe:
  case 0x2e:
  case 0x30:
  case 0x36:
  case 0x4e:
  case 0x6e:
  case 0x70:
  case 0x76:
    uVar8 = ((int)sVar19 & 0xffff00U) << 8 | uVar9 & 0xffff;
    goto LAB_00d28a99;
  case 0xf:
  case 0x1f:
  case 0x2f:
  case 0x3e:
  case 0x3f:
  case 0x5e:
  case 0x7e:
    uVar7 = DVar6 >> 0xc & 0xf;
    goto LAB_00d288d5;
  default:
    goto switchD_00d2849c_caseD_a;
  case 0x11:
    decode_rrr2_msub((DisasContext_conflict14 *)dcbase);
    break;
  case 0x12:
    decode_abs_storeb_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x13:
    decode_bit_sh_logic1((DisasContext_conflict14 *)dcbase);
    break;
  case 0x14:
    decode_bo_addrmode_ld_bitreverse_circular((DisasContext_conflict14 *)dcbase);
    break;
  case 0x15:
    decode_rrr_cond_select((DisasContext_conflict14 *)dcbase);
    break;
  case 0x16:
    decode_rr_idirect((DisasContext_conflict14 *)dcbase);
    break;
  case 0x17:
    tcg_gen_op2_tricore(pTVar27,INDEX_op_movi_i32,(TCGArg)(pTVar27->cpu_PSW_V + (long)pTVar27),0);
    if (pTVar27->cpu_PSW_SV != pTVar27->cpu_PSW_V) {
      tcg_gen_op2_tricore(pTVar27,INDEX_op_mov_i32,(TCGArg)(pTVar27->cpu_PSW_SV + (long)pTVar27),
                          (TCGArg)(pTVar27->cpu_PSW_V + (long)pTVar27));
    }
    if (pTVar27->cpu_PSW_AV != pTVar27->cpu_PSW_V) {
      tcg_gen_op2_tricore(pTVar27,INDEX_op_mov_i32,(TCGArg)(pTVar27->cpu_PSW_AV + (long)pTVar27),
                          (TCGArg)(pTVar27->cpu_PSW_V + (long)pTVar27));
    }
    pTVar11 = pTVar27->cpu_PSW_V;
    pTVar14 = pTVar27->cpu_PSW_SAV;
LAB_00d29d5c:
    if (pTVar14 == pTVar11) break;
    pTVar11 = pTVar11 + (long)pTVar27;
    TVar26 = INDEX_op_mov_i32;
    pTVar14 = pTVar14 + (long)pTVar27;
    goto LAB_00d2a006;
  case 0x19:
    decode_rcr_msub((DisasContext_conflict14 *)dcbase);
    break;
  case 0x1b:
    decode_rrpw_extract_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x21:
    decode_rrr1_maddq_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x22:
    pTVar14 = tcg_const_i32_tricore
                        (pTVar27,(DVar6 & 0xf000) << 0x10 | uVar9 & 0x3f |
                                 DVar30 >> 0x16 & 0xffffffc0 | DVar30 >> 0xc & 0x3c00);
    uVar23 = (ulong)(DVar6 >> 5 & 0x78);
    tcg_gen_qemu_ld_i32_tricore
              (pTVar27,*(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + uVar23),pTVar14,
               (long)dcbase[1].num_insns,MO_16);
    pTVar11 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + uVar23);
    tcg_gen_shli_i32_tricore(pTVar27,pTVar11,pTVar11,0x10);
LAB_00d29db5:
    pTVar22 = (TCGTemp *)(pTVar14 + (long)pTVar27);
    goto LAB_00d2a069;
  case 0x23:
    decode_bit_andacc((DisasContext_conflict14 *)dcbase);
    break;
  case 0x24:
    decode_bo_addrmode_stctx_post_pre_base((DisasContext_conflict14 *)dcbase);
    break;
  case 0x25:
    decode_rr_divide((DisasContext_conflict14 *)dcbase);
    break;
  case 0x29:
    decode_rc_mul((DisasContext_conflict14 *)dcbase);
    break;
  case 0x2b:
    decode_rrrw_extract_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x31:
    decode_rrr1_msubq_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x32:
    pTVar11 = tcg_const_i32_tricore
                        (pTVar27,(DVar6 & 0xf000) << 0x10 | uVar9 & 0x3f |
                                 DVar30 >> 0x16 & 0xffffffc0 | DVar30 >> 0xc & 0x3c00);
    pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
    tcg_gen_shri_i32_tricore
              (pTVar27,(TCGv_i32)((long)pTVar22 - (long)pTVar27),
               *(TCGv_i32 *)((long)pTVar27->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78)),0x10);
    tcg_gen_qemu_st_i32_tricore
              (pTVar27,(TCGv_i32)((long)pTVar22 - (long)pTVar27),pTVar11,(long)dcbase[1].num_insns,
               MO_16);
    tcg_temp_free_internal_tricore(pTVar27,pTVar22);
    pTVar22 = (TCGTemp *)(pTVar11 + (long)pTVar27);
    goto LAB_00d2a069;
  case 0x33:
    decode_bit_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x34:
    decode_bo_addrmode_ldmst_bitreverse_circular((DisasContext_conflict14 *)dcbase);
    break;
  case 0x35:
    decode_rrr_divide((DisasContext_conflict14 *)dcbase);
    break;
  case 0x37:
    uVar7 = 0;
LAB_00d288d5:
    uVar24 = 0;
LAB_00d28a51:
    uVar20 = DVar6 >> 8 & 0xf;
    uVar8 = (int)(uVar9 << 0x11) >> 0x11;
    goto LAB_00d28ec2;
  case 0x39:
    decode_rr2_mul((DisasContext_conflict14 *)dcbase);
    break;
  case 0x3b:
    uVar8 = uVar8 & 0xf;
    uVar7 = DVar6 >> 0xc & 0xf;
    uVar24 = DVar30 >> 0x1c;
    uVar20 = DVar30 >> 0x17 & 0x1f;
    if (uVar8 == uVar7) {
      tcg_gen_rotli_i32_tricore(pTVar27,pTVar27->cpu_gpr_d[uVar24],pTVar27->cpu_gpr_d[uVar8],uVar20)
      ;
      break;
    }
    pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
    tcg_gen_shli_i32_tricore
              (pTVar27,(TCGv_i32)((long)pTVar22 - (long)pTVar27),pTVar27->cpu_gpr_d[uVar8],uVar20);
    tcg_gen_shri_i32_tricore
              (pTVar27,pTVar27->cpu_gpr_d[uVar24],pTVar27->cpu_gpr_d[uVar7],0x20 - uVar20);
    pTVar11 = (TCGv_i32)((long)&pTVar27->pool_cur + (long)pTVar27->cpu_gpr_d[uVar24]);
    tcg_gen_op3_tricore(pTVar27,INDEX_op_or_i32,(TCGArg)pTVar11,(TCGArg)pTVar11,(TCGArg)pTVar22);
    goto LAB_00d2a069;
  case 0x41:
    decode_rrr1_madd((DisasContext_conflict14 *)dcbase);
    break;
  case 0x42:
    decode_abs_ldw((DisasContext_conflict14 *)dcbase);
    break;
  case 0x43:
    decode_bit_logical_t((DisasContext_conflict14 *)dcbase);
    break;
  case 0x44:
    decode_bo_addrmode_post_pre_base((DisasContext_conflict14 *)dcbase);
    break;
  case 0x45:
    decode_rc_accumulator((DisasContext_conflict14 *)dcbase);
    break;
  case 0x47:
    decode_rc_logical_shift((DisasContext_conflict14 *)dcbase);
    break;
  case 0x49:
    decode_rr1_mulq((DisasContext_conflict14 *)dcbase);
    break;
  case 0x4b:
    local_68 = (TCGTemp *)(CONCAT44(local_68._4_4_,uVar8) & 0xffffffff0000000f);
    pTVar11 = tcg_const_i32_tricore(pTVar27,DVar6 >> 0xc & 0xf);
    pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
    pTVar15 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
    pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
    pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
    if ((uVar9 >> 0xc & 1) != 0) {
      generate_trap((DisasContext_conflict14 *)dcbase,2,3);
    }
    tcg_gen_andi_i32_tricore(pTVar27,pTVar15,pTVar27->cpu_gpr_d[(ulong)(DVar30 >> 0x1c) + 1],0x1f);
    tcg_gen_andi_i32_tricore(pTVar27,pTVar14,pTVar27->cpu_gpr_d[DVar30 >> 0x1c],0x1f);
    gen_insert((DisasContext_conflict14 *)dcbase,pTVar27->cpu_gpr_d[DVar30 >> 0x18 & 0xf],
               pTVar27->cpu_gpr_d[(ulong)local_68 & 0xffffffff],pTVar11,pTVar15,pTVar14);
    tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar11 + (long)pTVar27));
    tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar15 + (long)pTVar27));
LAB_00d29ec8:
    pTVar22 = (TCGTemp *)(pTVar14 + (long)pTVar27);
    goto LAB_00d2a5ba;
  case 0x4f:
  case 0x5f:
  case 0x6f:
  case 0x7f:
    uVar24 = (int)sVar19 >> 0xc;
    uVar7 = 0;
    goto LAB_00d28a51;
  case 0x51:
    decode_rrr1_msub((DisasContext_conflict14 *)dcbase);
    break;
  case 0x52:
    decode_abs_store((DisasContext_conflict14 *)dcbase);
    break;
  case 0x53:
    decode_bit_sh_logic2((DisasContext_conflict14 *)dcbase);
    break;
  case 0x54:
    decode_bo_addrmode_bitreverse_circular((DisasContext_conflict14 *)dcbase);
    break;
  case 0x55:
    decode_rcr_cond_select((DisasContext_conflict14 *)dcbase);
    break;
  case 0x56:
    decode_rc_serviceroutine((DisasContext_conflict14 *)dcbase);
    break;
  case 0x59:
    decode_rr1_mul((DisasContext_conflict14 *)dcbase);
    break;
  case 0x5b:
    decode_rcpw_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x61:
    decode_rrr1_maddsu_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x62:
    pTVar11 = (TCGv_i32)
              (long)(int)((DVar6 & 0xf000) << 0x10 | uVar9 & 0x3f | DVar30 >> 0x16 & 0xffffffc0 |
                         DVar30 >> 0xc & 0x3c00);
    pTVar14 = *(TCGv_i32 *)((long)pTVar27->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78));
LAB_00d29ffb:
    TVar26 = INDEX_op_movi_i32;
    pTVar14 = pTVar14 + (long)pTVar27;
LAB_00d2a006:
    tcg_gen_op2_tricore(pTVar27,TVar26,(TCGArg)pTVar14,(TCGArg)pTVar11);
    break;
  case 99:
    decode_bit_orand((DisasContext_conflict14 *)dcbase);
    break;
  case 0x6a:
    pTVar11 = tcg_const_i32_tricore
                        (pTVar27,(DVar6 & 0xf000) << 0x10 | uVar9 & 0x3f |
                                 DVar30 >> 0x16 & 0xffffffc0 | DVar30 >> 0xc & 0x3c00);
    pTVar22 = tcg_temp_new_internal_tricore(pTVar27,TCG_TYPE_I32,false);
    pTVar14 = (TCGv_i32)((long)pTVar22 - (long)pTVar27);
    tcg_gen_qemu_ld_i32_tricore(pTVar27,pTVar14,pTVar11,(long)dcbase[1].num_insns,MO_8);
    bVar29 = bVar29 & 7;
    tcg_gen_andi_i32_tricore(pTVar27,pTVar14,pTVar14,-2 << bVar29 | 0xfffffffeU >> 0x20 - bVar29);
    tcg_gen_ori_i32_tricore(pTVar27,pTVar14,pTVar14,(DVar6 >> 0xb & 1) << bVar29);
    tcg_gen_qemu_st_i32_tricore(pTVar27,pTVar14,pTVar11,(long)dcbase[1].num_insns,MO_8);
    tcg_temp_free_internal_tricore(pTVar27,(TCGTemp *)(pTVar11 + (long)pTVar27));
LAB_00d2a069:
    tcg_temp_free_internal_tricore(pTVar27,pTVar22);
    break;
  case 0x6b:
    decode_rcrw_insert((DisasContext_conflict14 *)dcbase);
    break;
  case 0x71:
    decode_rrr1_msubad_h((DisasContext_conflict14 *)dcbase);
    break;
  case 0x72:
    decode_abs_ldst_swap((DisasContext_conflict14 *)dcbase);
  }
LAB_00d2a5c4:
  addr = dcbase[1].pc_next;
  dcbase->pc_next = addr;
  if ((dcbase->is_jmp == DISAS_NEXT) &&
     ((uVar8 = addr - (dcbase->pc_first & 0xffffc000), 0x3fff < uVar8 ||
      ((0x3ffc < uVar8 && (uVar9 = cpu_lduw_code_tricore(env,addr), (uVar9 & 1) != 0)))))) {
    dcbase->is_jmp = DISAS_TOO_MANY;
  }
  return;
}

Assistant:

static void tricore_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = ctx->uc;
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CPUTriCoreState *env = cpu->env_ptr;
    uint16_t insn_lo;
    bool is_16bit;
    uint32_t insn_size;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        ctx->base.is_jmp = DISAS_UC_EXIT;
    } else {
        insn_lo = cpu_lduw_code(env, ctx->base.pc_next);
        is_16bit = tricore_insn_is_16bit(insn_lo);

        insn_size = is_16bit ? 2 : 4;
        // Unicorn: trace this instruction on request
        if (HOOK_EXISTS_BOUNDED(ctx->uc, UC_HOOK_CODE, ctx->base.pc_next)) {
            // Sync PC in advance
            gen_save_pc(ctx, ctx->base.pc_next);

            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX, ctx->uc,
                             ctx->base.pc_next);
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }

        if (is_16bit) {
            ctx->opcode = insn_lo;
            ctx->pc_succ_insn = ctx->base.pc_next + 2;
            decode_16Bit_opc(ctx);
        } else {
            uint32_t insn_hi = cpu_lduw_code(env, ctx->base.pc_next + 2);
            ctx->opcode = insn_hi << 16 | insn_lo;
            ctx->pc_succ_insn = ctx->base.pc_next + 4;
            decode_32Bit_opc(ctx);
        }
        ctx->base.pc_next = ctx->pc_succ_insn;

        if (ctx->base.is_jmp == DISAS_NEXT) {
            target_ulong page_start;

            page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
            if (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE
                || (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE - 3
                    && insn_crosses_page(env, ctx))) {
                ctx->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}